

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O3

void __thiscall
pstack::Procman::LiveProcess::LiveProcess
          (LiveProcess *this,Context *context,sptr *ex,pid_t pid_,bool alreadyStopped)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  mapped_type *pmVar3;
  long *local_b8 [2];
  long local_a8 [2];
  sptr local_98;
  long *local_88 [2];
  long local_78 [2];
  shared_ptr<pstack::Procman::LiveReader> local_68;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  sptr local_48;
  pid_t local_38;
  undefined1 local_31;
  pid_t pid__local;
  
  peVar2 = (ex->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = pid_;
  if (peVar2 == (element_type *)0x0) {
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"exe","");
    pstack::Context::procname((int)local_b8,(string *)context);
    pstack::Context::getImageForName((string *)&local_48,SUB81(context,0));
  }
  else {
    local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (ex->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  std::__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pstack::Procman::LiveReader>,pstack::Context&,int&,char_const(&)[4]>
            ((__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (allocator<pstack::Procman::LiveReader> *)&local_31,context,&local_38,
             (char (*) [4])"mem");
  std::__shared_ptr<pstack::CacheReader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pstack::CacheReader>,std::shared_ptr<pstack::Procman::LiveReader>>
            ((__shared_ptr<pstack::CacheReader,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<pstack::CacheReader> *)&local_31,&local_68);
  local_98.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_98.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_50;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Process::Process(&this->super_Process,context,&local_48,&local_98);
  if (local_98.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_68.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<pstack::Procman::LiveReader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (peVar2 == (element_type *)0x0) {
    if (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
  }
  else if (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_0013f280;
  this->pid = local_38;
  p_Var1 = &(this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ps_getpid((ps_prochandle *)this);
  if (alreadyStopped) {
    pmVar3 = std::
             map<int,_pstack::Procman::LiveProcess::Lwp,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Procman::LiveProcess::Lwp>_>_>
             ::operator[](&this->stoppedLWPs,&this->pid);
    pmVar3->stopCount = 1;
  }
  return;
}

Assistant:

LiveProcess::LiveProcess(Context &context, Elf::Object::sptr &ex, pid_t pid_, bool alreadyStopped)
    : Process(
            context,
            ex ? ex : context.getImageForName(context.procname(pid_, "exe")),
            std::make_shared<CacheReader>(std::make_shared<LiveReader>(context, pid_, "mem")))
    , pid(pid_)
{
    (void)ps_getpid(this);
    if (alreadyStopped)
       stoppedLWPs[pid].stopCount = 1;
}